

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O1

ssize_t __thiscall
LASreadItemCompressed_POINT10_v2::read
          (LASreadItemCompressed_POINT10_v2 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  U32 UVar5;
  U32 UVar6;
  I32 IVar7;
  ArithmeticModel *pAVar8;
  ulong uVar9;
  uint uVar10;
  undefined4 in_register_00000034;
  undefined8 *puVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  StreamingMedian5 *pSVar15;
  byte local_31;
  
  puVar11 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  UVar5 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_changed_values);
  if (UVar5 == 0) {
    uVar9 = (ulong)(this->last_item[0xe] & 7);
    uVar12 = this->last_item[0xe] >> 3 & 7;
    uVar14 = (ulong)number_return_map[0][uVar9 + (uVar12 << 3)];
    local_31 = number_return_level[0][uVar9 + (uVar12 << 3)];
  }
  else {
    if ((UVar5 & 0x20) != 0) {
      if (this->m_bit_byte[this->last_item[0xe]] == (ArithmeticModel *)0x0) {
        pAVar8 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_bit_byte[this->last_item[0xe]] = pAVar8;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar8,(U32 *)0x0);
      }
      UVar6 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_bit_byte[this->last_item[0xe]]);
      this->last_item[0xe] = (U8)UVar6;
    }
    uVar9 = (ulong)(this->last_item[0xe] & 7);
    uVar12 = this->last_item[0xe] >> 3 & 7;
    bVar1 = number_return_map[0][uVar9 + uVar12 * 8];
    uVar14 = (ulong)bVar1;
    local_31 = number_return_level[0][uVar9 + uVar12 * 8];
    if ((UVar5 & 0x10) == 0) {
      *(U16 *)(this->last_item + 0xc) = this->last_intensity[uVar14];
    }
    else {
      uVar13 = (uint)bVar1;
      UVar6 = 3;
      if (uVar13 < 3) {
        UVar6 = (U32)bVar1;
      }
      IVar7 = IntegerCompressor::decompress
                        (this->ic_intensity,(uint)this->last_intensity[uVar13],UVar6);
      *(U16 *)(this->last_item + 0xc) = (U16)IVar7;
      this->last_intensity[uVar13] = (U16)IVar7;
    }
    if ((UVar5 & 8) != 0) {
      if (this->m_classification[this->last_item[0xf]] == (ArithmeticModel *)0x0) {
        pAVar8 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_classification[this->last_item[0xf]] = pAVar8;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar8,(U32 *)0x0);
      }
      UVar6 = ArithmeticDecoder::decodeSymbol
                        (this->dec,this->m_classification[this->last_item[0xf]]);
      this->last_item[0xf] = (U8)UVar6;
    }
    if ((UVar5 & 4) != 0) {
      UVar6 = ArithmeticDecoder::decodeSymbol
                        (this->dec,
                         *(ArithmeticModel **)
                          ((long)this->m_scan_angle_rank + (ulong)(this->last_item[0xe] >> 3 & 8)));
      this->last_item[0x10] = this->last_item[0x10] + (char)UVar6;
    }
    if ((UVar5 & 2) != 0) {
      if (this->m_user_data[this->last_item[0x11]] == (ArithmeticModel *)0x0) {
        pAVar8 = ArithmeticDecoder::createSymbolModel(this->dec,0x100);
        this->m_user_data[this->last_item[0x11]] = pAVar8;
        ArithmeticDecoder::initSymbolModel(this->dec,pAVar8,(U32 *)0x0);
      }
      UVar6 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_user_data[this->last_item[0x11]]);
      this->last_item[0x11] = (U8)UVar6;
    }
    if ((UVar5 & 1) != 0) {
      IVar7 = IntegerCompressor::decompress
                        (this->ic_point_source_ID,(uint)*(ushort *)(this->last_item + 0x12),0);
      *(short *)(this->last_item + 0x12) = (short)IVar7;
    }
  }
  pSVar15 = this->last_x_diff_median5 + uVar14;
  uVar12 = (uint)((char)uVar12 == '\x01');
  IVar7 = IntegerCompressor::decompress
                    (this->ic_dx,this->last_x_diff_median5[uVar14].values[2],uVar12);
  *(int *)this->last_item = *(int *)this->last_item + IVar7;
  iVar2 = this->last_x_diff_median5[uVar14].values[2];
  if (this->last_x_diff_median5[uVar14].high == true) {
    iVar3 = this->last_x_diff_median5[uVar14].values[3];
    if (IVar7 < iVar2) {
      this->last_x_diff_median5[uVar14].values[4] = iVar3;
      this->last_x_diff_median5[uVar14].values[3] = iVar2;
      iVar2 = pSVar15->values[0];
      iVar3 = this->last_x_diff_median5[uVar14].values[1];
      if (IVar7 < iVar2) {
        this->last_x_diff_median5[uVar14].values[2] = iVar3;
        this->last_x_diff_median5[uVar14].values[1] = iVar2;
        pSVar15->values[0] = IVar7;
      }
      else if (IVar7 < iVar3) {
        this->last_x_diff_median5[uVar14].values[2] = iVar3;
        this->last_x_diff_median5[uVar14].values[1] = IVar7;
      }
      else {
LAB_001280ae:
        this->last_x_diff_median5[uVar14].values[2] = IVar7;
      }
    }
    else {
      if (IVar7 < iVar3) {
        this->last_x_diff_median5[uVar14].values[4] = iVar3;
        this->last_x_diff_median5[uVar14].values[3] = IVar7;
      }
      else {
        this->last_x_diff_median5[uVar14].values[4] = IVar7;
      }
      this->last_x_diff_median5[uVar14].high = false;
    }
  }
  else {
    iVar3 = this->last_x_diff_median5[uVar14].values[1];
    if (iVar2 < IVar7) {
      pSVar15->values[0] = iVar3;
      this->last_x_diff_median5[uVar14].values[1] = iVar2;
      iVar2 = this->last_x_diff_median5[uVar14].values[3];
      iVar3 = this->last_x_diff_median5[uVar14].values[4];
      if (iVar3 < IVar7) {
        this->last_x_diff_median5[uVar14].values[2] = iVar2;
        this->last_x_diff_median5[uVar14].values[3] = iVar3;
        this->last_x_diff_median5[uVar14].values[4] = IVar7;
      }
      else {
        if (IVar7 <= iVar2) goto LAB_001280ae;
        this->last_x_diff_median5[uVar14].values[2] = iVar2;
        this->last_x_diff_median5[uVar14].values[3] = IVar7;
      }
    }
    else {
      if (iVar3 < IVar7) {
        pSVar15->values[0] = iVar3;
        this->last_x_diff_median5[uVar14].values[1] = IVar7;
      }
      else {
        pSVar15->values[0] = IVar7;
      }
      this->last_x_diff_median5[uVar14].high = true;
    }
  }
  pSVar15 = this->last_y_diff_median5 + uVar14;
  uVar13 = this->ic_dx->k;
  uVar10 = 0x14;
  if (uVar13 < 0x14) {
    uVar10 = uVar13 & 0xfffffffe;
  }
  IVar7 = IntegerCompressor::decompress
                    (this->ic_dy,this->last_y_diff_median5[uVar14].values[2],uVar10 | uVar12);
  *(int *)(this->last_item + 4) = *(int *)(this->last_item + 4) + IVar7;
  iVar2 = this->last_y_diff_median5[uVar14].values[2];
  if (this->last_y_diff_median5[uVar14].high == true) {
    iVar3 = this->last_y_diff_median5[uVar14].values[3];
    if (iVar2 <= IVar7) {
      if (IVar7 < iVar3) {
        this->last_y_diff_median5[uVar14].values[4] = iVar3;
        this->last_y_diff_median5[uVar14].values[3] = IVar7;
      }
      else {
        this->last_y_diff_median5[uVar14].values[4] = IVar7;
      }
      this->last_y_diff_median5[uVar14].high = false;
      goto LAB_001281a1;
    }
    this->last_y_diff_median5[uVar14].values[4] = iVar3;
    this->last_y_diff_median5[uVar14].values[3] = iVar2;
    iVar2 = pSVar15->values[0];
    iVar3 = this->last_y_diff_median5[uVar14].values[1];
    if (IVar7 < iVar2) {
      this->last_y_diff_median5[uVar14].values[2] = iVar3;
      this->last_y_diff_median5[uVar14].values[1] = iVar2;
      pSVar15->values[0] = IVar7;
      goto LAB_001281a1;
    }
    if (IVar7 < iVar3) {
      this->last_y_diff_median5[uVar14].values[2] = iVar3;
      this->last_y_diff_median5[uVar14].values[1] = IVar7;
      goto LAB_001281a1;
    }
  }
  else {
    iVar3 = this->last_y_diff_median5[uVar14].values[1];
    if (IVar7 <= iVar2) {
      if (iVar3 < IVar7) {
        pSVar15->values[0] = iVar3;
        this->last_y_diff_median5[uVar14].values[1] = IVar7;
      }
      else {
        pSVar15->values[0] = IVar7;
      }
      this->last_y_diff_median5[uVar14].high = true;
      goto LAB_001281a1;
    }
    pSVar15->values[0] = iVar3;
    this->last_y_diff_median5[uVar14].values[1] = iVar2;
    iVar2 = this->last_y_diff_median5[uVar14].values[3];
    iVar3 = this->last_y_diff_median5[uVar14].values[4];
    if (iVar3 < IVar7) {
      this->last_y_diff_median5[uVar14].values[2] = iVar2;
      this->last_y_diff_median5[uVar14].values[3] = iVar3;
      this->last_y_diff_median5[uVar14].values[4] = IVar7;
      goto LAB_001281a1;
    }
    if (iVar2 < IVar7) {
      this->last_y_diff_median5[uVar14].values[2] = iVar2;
      this->last_y_diff_median5[uVar14].values[3] = IVar7;
      goto LAB_001281a1;
    }
  }
  this->last_y_diff_median5[uVar14].values[2] = IVar7;
LAB_001281a1:
  uVar10 = this->ic_dy->k + this->ic_dx->k;
  uVar13 = 0x12;
  if (uVar10 < 0x24) {
    uVar13 = uVar10 >> 1 & 0xfffffffe;
  }
  IVar7 = IntegerCompressor::decompress(this->ic_z,this->last_height[local_31],uVar13 | uVar12);
  *(I32 *)(this->last_item + 8) = IVar7;
  this->last_height[local_31] = IVar7;
  uVar12 = *(uint *)(this->last_item + 0x10);
  *(uint *)(puVar11 + 2) = uVar12;
  uVar4 = *(undefined8 *)(this->last_item + 8);
  *puVar11 = *(undefined8 *)this->last_item;
  puVar11[1] = uVar4;
  return (ulong)uVar12;
}

Assistant:

inline void LASreadItemCompressed_POINT10_v2::read(U8* item, U32& context)
{
  U32 r, n, m, l;
  U32 k_bits;
  I32 median, diff;

  // decompress which other values have changed
  I32 changed_values = dec->decodeSymbol(m_changed_values);

  if (changed_values)
  {
    // decompress the edge_of_flight_line, scan_direction_flag, ... if it has changed
    if (changed_values & 32)
    {
      if (m_bit_byte[last_item[14]] == 0)
      {
        m_bit_byte[last_item[14]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_bit_byte[last_item[14]]);
      }
      last_item[14] = (U8)dec->decodeSymbol(m_bit_byte[last_item[14]]);
    }

    r = ((LASpoint10*)last_item)->return_number;
    n = ((LASpoint10*)last_item)->number_of_returns_of_given_pulse;
    m = number_return_map[n][r];
    l = number_return_level[n][r];

    // decompress the intensity if it has changed
    if (changed_values & 16)
    {
      ((LASpoint10*)last_item)->intensity = (U16)ic_intensity->decompress(last_intensity[m], (m < 3 ? m : 3));
      last_intensity[m] = ((LASpoint10*)last_item)->intensity;
    }
    else
    {
      ((LASpoint10*)last_item)->intensity = last_intensity[m];
    }

    // decompress the classification ... if it has changed
    if (changed_values & 8)
    {
      if (m_classification[last_item[15]] == 0)
      {
        m_classification[last_item[15]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_classification[last_item[15]]);
      }
      last_item[15] = (U8)dec->decodeSymbol(m_classification[last_item[15]]);
    }
    
    // decompress the scan_angle_rank ... if it has changed
    if (changed_values & 4)
    {
      I32 val = dec->decodeSymbol(m_scan_angle_rank[((LASpoint10*)last_item)->scan_direction_flag]);
      last_item[16] = U8_FOLD(val + last_item[16]);
    }

    // decompress the user_data ... if it has changed
    if (changed_values & 2)
    {
      if (m_user_data[last_item[17]] == 0)
      {
        m_user_data[last_item[17]] = dec->createSymbolModel(256);
        dec->initSymbolModel(m_user_data[last_item[17]]);
      }
      last_item[17] = (U8)dec->decodeSymbol(m_user_data[last_item[17]]);
    }

    // decompress the point_source_ID ... if it has changed
    if (changed_values & 1)
    {
      ((LASpoint10*)last_item)->point_source_ID = (U16)ic_point_source_ID->decompress(((LASpoint10*)last_item)->point_source_ID);
    }
  }
  else
  {
    r = ((LASpoint10*)last_item)->return_number;
    n = ((LASpoint10*)last_item)->number_of_returns_of_given_pulse;
    m = number_return_map[n][r];
    l = number_return_level[n][r];
  }

  // decompress x coordinate
  median = last_x_diff_median5[m].get();
  diff = ic_dx->decompress(median, n==1);
  ((LASpoint10*)last_item)->x += diff;
  last_x_diff_median5[m].add(diff);

  // decompress y coordinate
  median = last_y_diff_median5[m].get();
  k_bits = ic_dx->getK();
  diff = ic_dy->decompress(median, (n==1) + ( k_bits < 20 ? U32_ZERO_BIT_0(k_bits) : 20 ));
  ((LASpoint10*)last_item)->y += diff;
  last_y_diff_median5[m].add(diff);

  // decompress z coordinate
  k_bits = (ic_dx->getK() + ic_dy->getK()) / 2;
  ((LASpoint10*)last_item)->z = ic_z->decompress(last_height[l], (n==1) + (k_bits < 18 ? U32_ZERO_BIT_0(k_bits) : 18));
  last_height[l] = ((LASpoint10*)last_item)->z;

  // copy the last point
  memcpy(item, last_item, 20);
}